

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fitscore.c
# Opt level: O1

int ffc2l(char *cval,int *lval,int *status)

{
  bool bVar1;
  char dtype;
  double dval;
  long ival;
  char msg [81];
  char sval [81];
  char local_e9;
  double local_e8;
  long local_e0;
  char local_d8 [96];
  char local_78 [88];
  
  if (0 < *status) {
    return *status;
  }
  if (*cval == '\0') {
    *status = 0xcc;
    return 0xcc;
  }
  ffc2x(cval,&local_e9,&local_e0,lval,local_78,&local_e8,status);
  if ((local_e9 == 'X') || (local_e9 == 'C')) {
    *status = 0x194;
  }
  if (*status < 1) {
    if (local_e9 == 'F') {
      bVar1 = (bool)(-(local_e8 != 0.0) & 1);
    }
    else {
      if (local_e9 != 'I') goto LAB_00188118;
      bVar1 = local_e0 != 0;
    }
    *lval = (uint)bVar1;
  }
  else {
    *lval = 0;
    builtin_strncpy(local_d8 + 0x20," as a logical: ",0x10);
    builtin_strncpy(local_d8 + 0x10,"valuating string",0x10);
    builtin_strncpy(local_d8,"Error in ffc2l e",0x10);
    strncat(local_d8,cval,0x1e);
    ffxmsg(5,local_d8);
  }
LAB_00188118:
  return *status;
}

Assistant:

int ffc2l(const char *cval,  /* I - string representation of the value */
         int *lval,          /* O - numerical value of the input string */
         int *status)        /* IO - error status */
/*
  convert formatted string to a logical value, doing implicit
  datatype conversion if necessary
*/
{
    char dtype, sval[81], msg[81];
    long ival;
    double dval;
    
    if (*status > 0)           /* inherit input status value if > 0 */
        return(*status);

    if (cval[0] == '\0')
        return(*status = VALUE_UNDEFINED);  /* null value string */

    /* convert the keyword to its native datatype */
    ffc2x(cval, &dtype, &ival, lval, sval, &dval, status);

    if (dtype == 'C' || dtype == 'X' )
        *status = BAD_LOGICALKEY;

    if (*status > 0)
    {
            *lval = 0;
            strcpy(msg,"Error in ffc2l evaluating string as a logical: ");
            strncat(msg,cval,30);
            ffpmsg(msg);
            return(*status);
    }

    if (dtype == 'I')
    {
        if (ival)
            *lval = 1;
        else
            *lval = 0;
    }
    else if (dtype == 'F')
    {
        if (dval)
            *lval = 1;
        else
            *lval = 0;
    }

    return(*status);
}